

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86.cpp
# Opt level: O2

int __thiscall
ncnn::BatchNorm_x86::forward_inplace(BatchNorm_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  void *pvVar11;
  _func_int **pp_Var12;
  size_t sVar13;
  size_t sVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  float *pfVar22;
  long lVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  
  iVar6 = bottom_top_blob->elempack;
  iVar21 = bottom_top_blob->dims;
  iVar7 = bottom_top_blob->w;
  uVar8 = bottom_top_blob->h;
  iVar15 = bottom_top_blob->d;
  uVar9 = bottom_top_blob->c;
  if (iVar21 == 2) {
    pp_Var12 = this->_vptr_BatchNorm_x86;
    uVar18 = 0;
    uVar17 = 0;
    if (0 < (int)uVar8) {
      uVar17 = (ulong)uVar8;
    }
    for (; uVar18 != uVar17; uVar18 = uVar18 + 1) {
      fVar4 = *(float *)(*(long *)(&this->field_0x1f8 + (long)pp_Var12[-3]) + uVar18 * 4);
      fVar5 = *(float *)(*(long *)(&this->field_0x240 + (long)pp_Var12[-3]) + uVar18 * 4);
      fVar24 = fVar4;
      fVar25 = fVar4;
      fVar26 = fVar4;
      fVar27 = fVar4;
      fVar28 = fVar5;
      fVar29 = fVar5;
      fVar30 = fVar5;
      fVar31 = fVar5;
      if (iVar6 == 4) {
        pfVar22 = (float *)(*(long *)(&this->field_0x1f8 + (long)pp_Var12[-3]) + uVar18 * 0x10);
        pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)pp_Var12[-3]) + uVar18 * 0x10);
        fVar24 = *pfVar22;
        fVar25 = pfVar22[1];
        fVar26 = pfVar22[2];
        fVar27 = pfVar22[3];
        fVar28 = *pfVar1;
        fVar29 = pfVar1[1];
        fVar30 = pfVar1[2];
        fVar31 = pfVar1[3];
      }
      iVar10 = bottom_top_blob->w;
      pvVar11 = bottom_top_blob->data;
      sVar13 = bottom_top_blob->elemsize;
      pfVar22 = (float *)(uVar18 * (long)iVar10 * sVar13 + (long)pvVar11);
      lVar20 = 0;
      for (iVar19 = 0; iVar19 + 3 < iVar6 * iVar7; iVar19 = iVar19 + 4) {
        *pfVar22 = *pfVar22 * fVar28 + fVar24;
        pfVar22[1] = pfVar22[1] * fVar29 + fVar25;
        pfVar22[2] = pfVar22[2] * fVar30 + fVar26;
        pfVar22[3] = pfVar22[3] * fVar31 + fVar27;
        pfVar22 = pfVar22 + 4;
        lVar20 = lVar20 + 4;
      }
      lVar16 = sVar13 * uVar18 * (long)iVar10;
      for (; (int)lVar20 < iVar6 * iVar7; lVar20 = lVar20 + 1) {
        *(float *)((long)pvVar11 + lVar20 * 4 + lVar16) =
             *(float *)((long)pvVar11 + lVar20 * 4 + lVar16) * fVar5 + fVar4;
      }
    }
  }
  else if (iVar21 == 1) {
    pvVar11 = bottom_top_blob->data;
    lVar20 = *(long *)(&this->field_0x1f8 + (long)this->_vptr_BatchNorm_x86[-3]);
    lVar16 = *(long *)(&this->field_0x240 + (long)this->_vptr_BatchNorm_x86[-3]);
    for (lVar23 = 0; (int)lVar23 + 3 < iVar6 * iVar7; lVar23 = lVar23 + 4) {
      pfVar22 = (float *)((long)pvVar11 + lVar23 * 4);
      fVar4 = pfVar22[1];
      fVar5 = pfVar22[2];
      fVar24 = pfVar22[3];
      pfVar1 = (float *)(lVar20 + lVar23 * 4);
      fVar25 = pfVar1[1];
      fVar26 = pfVar1[2];
      fVar27 = pfVar1[3];
      pfVar2 = (float *)(lVar16 + lVar23 * 4);
      fVar28 = pfVar2[1];
      fVar29 = pfVar2[2];
      fVar30 = pfVar2[3];
      pfVar3 = (float *)((long)pvVar11 + lVar23 * 4);
      *pfVar3 = *pfVar2 * *pfVar22 + *pfVar1;
      pfVar3[1] = fVar28 * fVar4 + fVar25;
      pfVar3[2] = fVar29 * fVar5 + fVar26;
      pfVar3[3] = fVar30 * fVar24 + fVar27;
    }
    for (; (int)lVar23 < iVar6 * iVar7; lVar23 = lVar23 + 1) {
      *(float *)((long)pvVar11 + lVar23 * 4) =
           *(float *)((long)pvVar11 + lVar23 * 4) * *(float *)(lVar16 + lVar23 * 4) +
           *(float *)(lVar20 + lVar23 * 4);
    }
  }
  if (iVar21 - 3U < 2) {
    iVar15 = iVar7 * iVar6 * uVar8 * iVar15;
    pp_Var12 = this->_vptr_BatchNorm_x86;
    uVar17 = 0;
    uVar18 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar18 = uVar17;
    }
    for (; uVar17 != uVar18; uVar17 = uVar17 + 1) {
      fVar4 = *(float *)(*(long *)(&this->field_0x1f8 + (long)pp_Var12[-3]) + uVar17 * 4);
      fVar5 = *(float *)(*(long *)(&this->field_0x240 + (long)pp_Var12[-3]) + uVar17 * 4);
      fVar24 = fVar4;
      fVar25 = fVar4;
      fVar26 = fVar4;
      fVar27 = fVar4;
      fVar28 = fVar5;
      fVar29 = fVar5;
      fVar30 = fVar5;
      fVar31 = fVar5;
      if (iVar6 == 4) {
        pfVar22 = (float *)(*(long *)(&this->field_0x1f8 + (long)pp_Var12[-3]) + uVar17 * 0x10);
        pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)pp_Var12[-3]) + uVar17 * 0x10);
        fVar24 = *pfVar22;
        fVar25 = pfVar22[1];
        fVar26 = pfVar22[2];
        fVar27 = pfVar22[3];
        fVar28 = *pfVar1;
        fVar29 = pfVar1[1];
        fVar30 = pfVar1[2];
        fVar31 = pfVar1[3];
      }
      sVar13 = bottom_top_blob->cstep;
      pvVar11 = bottom_top_blob->data;
      sVar14 = bottom_top_blob->elemsize;
      pfVar22 = (float *)(sVar13 * uVar17 * sVar14 + (long)pvVar11);
      lVar20 = 0;
      for (iVar21 = 0; iVar21 + 3 < iVar15; iVar21 = iVar21 + 4) {
        *pfVar22 = *pfVar22 * fVar28 + fVar24;
        pfVar22[1] = pfVar22[1] * fVar29 + fVar25;
        pfVar22[2] = pfVar22[2] * fVar30 + fVar26;
        pfVar22[3] = pfVar22[3] * fVar31 + fVar27;
        pfVar22 = pfVar22 + 4;
        lVar20 = lVar20 + 4;
      }
      lVar16 = sVar13 * sVar14 * uVar17;
      for (; (int)lVar20 < iVar15; lVar20 = lVar20 + 1) {
        *(float *)((long)pvVar11 + lVar20 * 4 + lVar16) =
             *(float *)((long)pvVar11 + lVar20 * 4 + lVar16) * fVar5 + fVar4;
      }
    }
  }
  return 0;
}

Assistant:

int BatchNorm_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int c = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        float* ptr = bottom_top_blob;
        const float* aptr = a_data;
        const float* bptr = b_data;

        const int size = w * elempack;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p512 = _mm512_loadu_ps(ptr);
            __m512 _a512 = _mm512_loadu_ps(aptr);
            __m512 _b512 = _mm512_loadu_ps(bptr);
            _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
            _mm512_storeu_ps(ptr, _p512);
            ptr += 16;
            aptr += 16;
            bptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p256 = _mm256_loadu_ps(ptr);
            __m256 _a256 = _mm256_loadu_ps(aptr);
            __m256 _b256 = _mm256_loadu_ps(bptr);
            _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
            _mm256_storeu_ps(ptr, _p256);
            ptr += 8;
            aptr += 8;
            bptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p128 = _mm_loadu_ps(ptr);
            __m128 _a128 = _mm_loadu_ps(aptr);
            __m128 _b128 = _mm_loadu_ps(bptr);
            _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
            _mm_storeu_ps(ptr, _p128);
            ptr += 4;
            aptr += 4;
            bptr += 4;
        }
#endif // __SSE__
        for (; i < size; i++)
        {
            *ptr = *bptr * *ptr + *aptr;
            ptr++;
            aptr++;
            bptr++;
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + i * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + i * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; j < size; j++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + q * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + q * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; i < size; i++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    return 0;
}